

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Converter.cpp
# Opt level: O0

bool __thiscall Process::Converter::checkValue(Converter *this,string *s)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  reference local_90;
  string *v;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *s_local;
  Converter *this_local;
  
  local_20 = s;
  s_local = (string *)this;
  bVar1 = std::operator==(s,"UWUAC");
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    bVar1 = isChar(this,local_20);
    if (!bVar1) {
      bVar1 = isNb(this,local_20);
      if (!bVar1) {
        std::operator+(&local_60,"The value : ",local_20);
        std::operator+(&local_40,&local_60," is not handled!");
        this_local._7_1_ = error(this,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
        goto LAB_00110f8d;
      }
    }
    bVar1 = isNb(this,local_20);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->_contVar);
      v = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->_contVar);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&v);
        if (!bVar1) break;
        local_90 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
        _Var2 = std::operator==(local_20,local_90);
        if (_Var2) {
          this_local._7_1_ = 1;
          goto LAB_00110f8d;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      std::operator+(&local_d0,"The value : ",local_20);
      std::operator+(&local_b0,&local_d0," is undefined!");
      this_local._7_1_ = error(this,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
LAB_00110f8d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Converter::checkValue(const std::string &s)
    {
        if (s == "UWUAC")
            return true;
        if (!isChar(s)
        && !isNb(s))
            return error("The value : " + s + " is not handled!");

        if (isNb(s))
            return true;

        for (const std::string &v : _contVar)
            if (s == v)
                return true;
        return error("The value : " + s + " is undefined!");
    }